

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>
wabt::WastLexer::CreateBufferLexer(string_view filename,void *data,size_t size)

{
  __uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true> this;
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> local_38;
  unsigned_long local_30;
  size_t size_local;
  void *data_local;
  string_view filename_local;
  
  data_local = (void *)filename.size_;
  this.super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
  super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl =
       (__uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>)filename.data_;
  size_local = size;
  filename_local.data_ = (char *)data;
  filename_local.size_ =
       (size_type)
       this.super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t.
       super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
       super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl;
  MakeUnique<wabt::LexerSource,void_const*&,unsigned_long&>
            ((wabt *)&local_38,(void **)&size_local,&local_30);
  MakeUnique<wabt::WastLexer,std::unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>>,wabt::string_view&>
            ((wabt *)this.
                     super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                     .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,&local_38,
             (string_view *)&data_local);
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::~unique_ptr
            (&local_38);
  return (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)
         (tuple<wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>)
         this.super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t.
         super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
         super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<WastLexer> WastLexer::CreateBufferLexer(string_view filename,
                                                        const void* data,
                                                        size_t size) {
  return MakeUnique<WastLexer>(MakeUnique<LexerSource>(data, size), filename);
}